

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blind_item_strategy.cpp
# Opt level: O0

void __thiscall
BlindItemStrategy::generateActions(BlindItemStrategy *this,PlayerSight *sight,Actions *actions)

{
  Randomizer *this_00;
  bool bVar1;
  Vec2 pos;
  bool flag_1;
  int local_24;
  bool flag;
  int gold;
  Actions *actions_local;
  PlayerSight *sight_local;
  BlindItemStrategy *this_local;
  
  if ((this->field_0xc & 1) == 0) {
    local_24 = sight->gold;
    if (0x18 < local_24) {
      if (this->prevBomb == -1) {
        bVar1 = true;
      }
      else {
        bVar1 = (sight->round - this->prevBomb) % 0x3c == 0;
      }
      if (bVar1) {
        this->prevBomb = sight->round;
        Actions::emplace(actions,BuyItem,0);
        this_00 = Randomizer::getInstance();
        pos = Randomizer::randPosition(this_00);
        Actions::emplace(actions,UseItem,0,pos);
        local_24 = local_24 + -0x19;
      }
    }
    if (4 < local_24) {
      if (this->prevWard == -1) {
        bVar1 = true;
      }
      else {
        bVar1 = (sight->round - this->prevWard) % 0x96 == 0;
      }
      if (bVar1) {
        this->prevWard = sight->round;
        Actions::emplace(actions,BuyItem,1);
        Actions::emplace(actions,UseItem,1,sight->pos);
      }
    }
  }
  return;
}

Assistant:

void BlindItemStrategy::generateActions(const PlayerSight &sight, Actions *actions)
{
    CHECK_DISABLED

    int gold = sight.gold;
    if (gold >= BombPrice)
    {
        bool flag = false;
        if (prevBomb == -1)
            flag = true;
        else if ((sight.round - prevBomb) % BombCD == 0)
            flag = true;
        if (flag)
        {
            prevBomb = sight.round;
            actions->emplace(BuyItem, BombItem);
            actions->emplace(UseItem, BombItem, Randomizer::getInstance()->randPosition());
            gold -= BombPrice;
        }
    }
    if (gold >= WardPrice)
    {
        bool flag = false;
        if (prevWard == -1)
            flag = true;
        else if ((sight.round - prevWard) % WardCD == 0)
            flag = true;
        if (flag)
        {
            prevWard = sight.round;
            actions->emplace(BuyItem, WardItem);
            actions->emplace(UseItem, WardItem, sight.pos);
        }
    }
}